

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guardedTests.cpp
# Opt level: O3

void __thiscall cow_guarded_cow_guarded_1_Test::TestBody(cow_guarded_cow_guarded_1_Test *this)

{
  atomic<int> *paVar1;
  int *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  cow_guarded<int,_std::timed_mutex> *pcVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer *__ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  char *pcVar7;
  char *in_R9;
  cow_guarded<int,_std::timed_mutex> *pcVar8;
  bool bVar9;
  thread th3;
  thread th2;
  thread th1;
  handle data_handle;
  cow_guarded<int,_std::timed_mutex> data;
  AssertHelper local_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [32];
  cow_guarded<int,_std::timed_mutex> local_b0;
  
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::cow_guarded<int>(&local_b0,(int *)local_e0);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock((handle *)local_e0,&local_b0);
  *(int *)local_d0._16_8_ = *(int *)local_d0._16_8_ + 1;
  std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::~unique_ptr
            ((unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter> *)
             local_e0);
  pcVar8 = (cow_guarded<int,_std::timed_mutex> *)&local_b0.m_data.m_right;
  LOCK();
  paVar1 = &local_b0.m_data.m_leftReadCount +
           ((byte)~(byte)local_b0.m_data.m_countingLeft._M_base._M_i & 1);
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  bVar9 = ((byte)local_b0.m_data.m_readingLeft._M_base._M_i & 1) != 0;
  pcVar4 = pcVar8;
  if (bVar9) {
    pcVar4 = &local_b0;
  }
  piVar2 = (pcVar4->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = &local_b0.m_data.m_right.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  p_Var5 = p_Var6;
  if (bVar9) {
    p_Var5 = &local_b0.m_data.m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  }
  p_Var3 = p_Var5->_M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  LOCK();
  paVar1 = &local_b0.m_data.m_leftReadCount +
           ((byte)~(byte)local_b0.m_data.m_countingLeft._M_base._M_i & 1);
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  local_100[0] = (internal)(piVar2 != (int *)0x0);
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (piVar2 == (int *)0x0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e0,(internal *)local_100,(AssertionResult *)"data_handle != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x29,(char *)local_e0._0_8_);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((mutex_type *)local_e0._0_8_ != (mutex_type *)local_d0) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
    }
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
  }
  local_100._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e0,"*data_handle","1",piVar2,(int *)local_100);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)local_e0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x2a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_100 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_e0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._8_8_
                );
  }
  local_100 = (undefined1  [8])0x0;
  local_e0._0_8_ = operator_new(0x10);
  (((mutex_type *)local_e0._0_8_)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_00173960;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&(((mutex_type *)local_e0._0_8_)->super___mutex_base)._M_mutex + 8) = &local_b0;
  std::thread::_M_start_thread(local_100,local_e0,0);
  if ((mutex_type *)local_e0._0_8_ != (mutex_type *)0x0) {
    (**(code **)(*(long *)local_e0._0_8_ + 8))();
  }
  local_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e0._0_8_ = operator_new(0x10);
  (((mutex_type *)local_e0._0_8_)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_001739a0;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&(((mutex_type *)local_e0._0_8_)->super___mutex_base)._M_mutex + 8) = &local_b0;
  std::thread::_M_start_thread(&local_110,local_e0,0);
  if ((mutex_type *)local_e0._0_8_ != (mutex_type *)0x0) {
    (**(code **)(*(long *)local_e0._0_8_ + 8))();
  }
  local_118.data_ = (AssertHelperData *)0x0;
  local_e0._0_8_ = operator_new(0x10);
  (((mutex_type *)local_e0._0_8_)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_001739e0;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&(((mutex_type *)local_e0._0_8_)->super___mutex_base)._M_mutex + 8) = &local_b0;
  std::thread::_M_start_thread(&local_118,local_e0,0);
  if ((mutex_type *)local_e0._0_8_ != (mutex_type *)0x0) {
    (**(code **)(*(long *)local_e0._0_8_ + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  if (((local_118.data_ == (AssertHelperData *)0x0) &&
      (local_110._M_head_impl ==
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) &&
     (local_100 == (undefined1  [8])0x0)) {
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock((handle *)local_e0,&local_b0);
    LOCK();
    paVar1 = &local_b0.m_data.m_leftReadCount +
             ((byte)~(byte)local_b0.m_data.m_countingLeft._M_base._M_i & 1);
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    bVar9 = ((byte)local_b0.m_data.m_readingLeft._M_base._M_i & 1) != 0;
    pcVar4 = pcVar8;
    if (bVar9) {
      pcVar4 = &local_b0;
    }
    piVar2 = (pcVar4->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = p_Var6;
    if (bVar9) {
      p_Var5 = &local_b0.m_data.m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    }
    p_Var3 = p_Var5->_M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    LOCK();
    paVar1 = &local_b0.m_data.m_leftReadCount +
             ((byte)~(byte)local_b0.m_data.m_countingLeft._M_base._M_i & 1);
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    *(int *)local_d0._16_8_ = *(int *)local_d0._16_8_ + 1;
    local_110._M_head_impl._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_100,"*data_handle","2",(int *)local_d0._16_8_,(int *)&local_110);
    if (local_100[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (local_f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x4d,pcVar7);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if (local_110._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_110._M_head_impl + 8))();
      }
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
    local_110._M_head_impl._0_1_ = piVar2 != (int *)0x0;
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (piVar2 == (int *)0x0) {
      testing::Message::Message((Message *)&local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_100,(internal *)&local_110,
                 (AssertionResult *)"data_handle2 != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_d0 + 0x18),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x4f,(char *)local_100);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_d0 + 0x18),(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_d0 + 0x18));
      if (local_100 != (undefined1  [8])&local_f0) {
        operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
      }
      if (local_118.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_118.data_ + 8))();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
    }
    local_110._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_100,"*data_handle2","1",piVar2,(int *)&local_110);
    if (local_100[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (local_f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x50,pcVar7);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if (local_110._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_110._M_head_impl + 8))();
      }
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
    gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::handle::cancel((handle *)local_e0);
    local_110._M_head_impl._0_1_ = (int *)local_d0._16_8_ == (int *)0x0;
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((int *)local_d0._16_8_ != (int *)0x0) {
      testing::Message::Message((Message *)&local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_100,(internal *)&local_110,
                 (AssertionResult *)"data_handle == nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_d0 + 0x18),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x53,(char *)local_100);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_d0 + 0x18),(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_d0 + 0x18));
      if (local_100 != (undefined1  [8])&local_f0) {
        operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
      }
      if (local_118.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_118.data_ + 8))();
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
    }
    local_110._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_100,"*data_handle2","1",piVar2,(int *)&local_110);
    if (local_100[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (local_f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x56,pcVar7);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if (local_110._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_110._M_head_impl + 8))();
      }
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::~unique_ptr
              ((unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter> *)
               local_e0);
    LOCK();
    paVar1 = &local_b0.m_data.m_leftReadCount +
             ((byte)~(byte)local_b0.m_data.m_countingLeft._M_base._M_i & 1);
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    bVar9 = ((byte)local_b0.m_data.m_readingLeft._M_base._M_i & 1) != 0;
    if (bVar9) {
      pcVar8 = &local_b0;
    }
    piVar2 = (pcVar8->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (bVar9) {
      p_Var6 = &local_b0.m_data.m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    }
    p_Var3 = p_Var6->_M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    LOCK();
    paVar1 = &local_b0.m_data.m_leftReadCount +
             ((byte)~(byte)local_b0.m_data.m_countingLeft._M_base._M_i & 1);
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    local_100[0] = (internal)(piVar2 != (int *)0x0);
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (piVar2 == (int *)0x0) {
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)local_100,
                 (AssertionResult *)"data_handle != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x5c,(char *)local_e0._0_8_);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((mutex_type *)local_e0._0_8_ != (mutex_type *)local_d0) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
      }
      if (local_110._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_110._M_head_impl + 8))();
      }
      if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f8,local_f8);
      }
    }
    local_100._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_e0,"*data_handle","1",piVar2,(int *)local_100);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_100);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((_Alloc_hider *)local_e0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x5d,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
      if (local_100 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_100 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_e0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_e0._8_8_);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (local_b0.m_data.m_right.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.m_data.m_right.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_b0.m_data.m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.m_data.m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  std::terminate();
}

Assistant:

TEST(cow_guarded, cow_guarded_1)
{
    cow_guarded<int, std::timed_mutex> data(0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);

        std::thread th1([&data]() {
            auto data_handle2 = data.try_lock_shared();
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th2([&data]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th3([&data]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        th1.join();

        th2.join();
        th3.join();
    }

    {
        auto data_handle = data.lock();

        auto data_handle2 = data.lock_shared();

        ++(*data_handle);
        EXPECT_EQ(*data_handle, 2);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);

        data_handle.cancel();
        EXPECT_TRUE(data_handle == nullptr);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);
    }
}